

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<unsigned_int> * __thiscall
wasm::WATParser::ParseDefsCtx::getLocalFromIdx
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *this,uint32_t idx)

{
  size_t sVar1;
  allocator<char> local_b9;
  string local_b8;
  Err local_98;
  allocator<char> local_61;
  string local_60;
  Err local_40;
  uint32_t local_1c;
  ParseDefsCtx *pPStack_18;
  uint32_t idx_local;
  ParseDefsCtx *this_local;
  
  local_1c = idx;
  pPStack_18 = this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  if (this->func == (Function *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"cannot access locals outside of a function",&local_61);
    Lexer::err(&local_40,&this->in,&local_60);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    sVar1 = Function::getNumLocals(this->func);
    if (idx < sVar1) {
      Result<unsigned_int>::Result<unsigned_int>(__return_storage_ptr__,&local_1c);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"local index out of bounds",&local_b9);
      Lexer::err(&local_98,&this->in,&local_b8);
      Result<unsigned_int>::Result(__return_storage_ptr__,&local_98);
      wasm::Err::~Err(&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getLocalFromIdx(uint32_t idx) {
    if (!func) {
      return in.err("cannot access locals outside of a function");
    }
    if (idx >= func->getNumLocals()) {
      return in.err("local index out of bounds");
    }
    return idx;
  }